

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderValidatePop(xmlTextReaderPtr reader)

{
  uint uVar1;
  int iVar2;
  xmlChar **qname_00;
  int ret;
  xmlChar *qname;
  xmlChar buf [50];
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  unique0x00012000 = reader->node;
  if (((reader->validate == XML_TEXTREADER_VALIDATE_DTD) && (reader->ctxt != (xmlParserCtxtPtr)0x0))
     && (reader->ctxt->validate == 1)) {
    if ((unique0x00012000->ns == (xmlNs *)0x0) || (unique0x00012000->ns->prefix == (xmlChar *)0x0))
    {
      uVar1 = xmlValidatePopElement
                        (&reader->ctxt->vctxt,reader->ctxt->myDoc,unique0x00012000,
                         unique0x00012000->name);
      reader->ctxt->valid = uVar1 & reader->ctxt->valid;
    }
    else {
      qname_00 = (xmlChar **)
                 xmlBuildQName(unique0x00012000->name,unique0x00012000->ns->prefix,(xmlChar *)&qname
                               ,0x32);
      if (qname_00 == (xmlChar **)0x0) {
        xmlTextReaderErrMemory(reader);
        return -1;
      }
      uVar1 = xmlValidatePopElement
                        (&reader->ctxt->vctxt,reader->ctxt->myDoc,stack0xffffffffffffffe0,
                         (xmlChar *)qname_00);
      reader->ctxt->valid = uVar1 & reader->ctxt->valid;
      if (qname_00 != &qname) {
        (*xmlFree)(qname_00);
      }
    }
  }
  if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
     (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) {
    if (reader->rngFullNode != (xmlNodePtr)0x0) {
      if (stack0xffffffffffffffe0 == reader->rngFullNode) {
        reader->rngFullNode = (xmlNodePtr)0x0;
      }
      return 0;
    }
    iVar2 = xmlRelaxNGValidatePopElement
                      (reader->rngValidCtxt,reader->ctxt->myDoc,stack0xffffffffffffffe0);
    if (iVar2 != 1) {
      reader->rngValidErrors = reader->rngValidErrors + 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlTextReaderValidatePop(xmlTextReaderPtr reader) {
    xmlNodePtr node = reader->node;

#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	if ((node->ns == NULL) || (node->ns->prefix == NULL)) {
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, node->name);
	} else {
            xmlChar buf[50];
	    xmlChar *qname;

	    qname = xmlBuildQName(node->name, node->ns->prefix, buf, 50);
            if (qname == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, qname);
            if (qname != buf)
	        xmlFree(qname);
	}
        /*if (reader->ctxt->errNo == XML_ERR_NO_MEMORY) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
            return(-1);
        }*/
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_RELAXNG_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) {
	    if (node == reader->rngFullNode)
	        reader->rngFullNode = NULL;
	    return(0);
	}
	ret = xmlRelaxNGValidatePopElement(reader->rngValidCtxt,
	                                   reader->ctxt->myDoc,
					   node);
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif

    return(0);
}